

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::sub(Parser *this)

{
  ExprNode *pEVar1;
  undefined8 extraout_RAX;
  Token closeBrace;
  Token openBrace;
  allocator<char> local_172;
  allocator<char> local_171;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  Token local_f0;
  Token local_80;
  
  Tokenizer::getToken(&local_80,this->tokenizer);
  if (local_80._symbol == '[') {
    pEVar1 = exprOrTest(this);
    Tokenizer::getToken(&local_f0,this->tokenizer);
    if (local_f0._symbol == ']') {
      Token::~Token(&local_f0);
      Token::~Token(&local_80);
      return pEVar1;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Parser::sub",(allocator<char> *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Expected an [ sign, instead got",&local_172);
    die(this,&local_110,&local_130,&local_80);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Parser::sub",&local_172);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"Expected an ] sign, instead got",&local_171);
  die(this,&local_150,&local_170,&local_f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  Token::~Token(&local_f0);
  Token::~Token(&local_80);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ExprNode *Parser::sub() {
    Token openBrace = tokenizer.getToken();
    if (!openBrace.isOpenBrace())
        die("Parser::sub", "Expected an [ sign, instead got", openBrace);
    ExprNode *subTest = test();
    Token closeBrace = tokenizer.getToken();
    if (!closeBrace.isCloseBrace())
        die("Parser::sub", "Expected an ] sign, instead got", closeBrace);
    return subTest;

}